

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimemagicrule.cpp
# Opt level: O0

Type QMimeMagicRule::type(QByteArray *theTypeName)

{
  bool bVar1;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  int i;
  QByteArrayView *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  Type TVar2;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  qsizetype in_stack_fffffffffffffff0;
  QOffsetStringArray<std::array<char,_65UL>,_std::array<unsigned_char,_10UL>_> *this;
  
  this = *(QOffsetStringArray<std::array<char,_65UL>,_std::array<unsigned_char,_10UL>_> **)
          (in_FS_OFFSET + 0x28);
  for (TVar2 = String; (int)TVar2 < 9; TVar2 = TVar2 + String) {
    QByteArrayView::QByteArrayView<QByteArray,_true>
              ((QByteArrayView *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_RDI);
    QOffsetStringArray<std::array<char,_65UL>,_std::array<unsigned_char,_10UL>_>::viewAt
              (this,in_stack_fffffffffffffff0);
    bVar1 = ::operator==((QByteArrayView *)CONCAT44(TVar2,in_stack_ffffffffffffffc0),
                         in_stack_ffffffffffffffb8);
    if (bVar1) goto LAB_008f335a;
  }
  TVar2 = Invalid;
LAB_008f335a:
  if (*(QOffsetStringArray<std::array<char,_65UL>,_std::array<unsigned_char,_10UL>_> **)
       (in_FS_OFFSET + 0x28) != this) {
    __stack_chk_fail();
  }
  return TVar2;
}

Assistant:

QMimeMagicRule::Type QMimeMagicRule::type(const QByteArray &theTypeName)
{
    for (int i = String; i <= Byte; ++i) {
        if (theTypeName == magicRuleTypes.viewAt(i))
            return Type(i);
    }
    return Invalid;
}